

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::SetDomain(ON_PolylineCurve *this,double t0,double t1)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  ON_Interval new_domain;
  ON_Interval old_domain;
  int count;
  bool rc;
  double t1_local;
  double t0_local;
  ON_PolylineCurve *this_local;
  
  old_domain.m_t[1]._7_1_ = false;
  iVar1 = ON_SimpleArray<double>::Count(&this->m_t);
  iVar1 = iVar1 + -1;
  if (0 < iVar1) {
    pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,0);
    if ((t0 == *pdVar2) && (!NAN(t0) && !NAN(*pdVar2))) {
      pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,iVar1);
      if ((t1 == *pdVar2) && (!NAN(t1) && !NAN(*pdVar2))) {
        old_domain.m_t[1]._7_1_ = true;
        goto LAB_00809a8d;
      }
    }
    if (t0 < t1) {
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
      ON_Interval::ON_Interval((ON_Interval *)local_48,t0,t1);
      pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,0);
      *pdVar2 = t0;
      pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,iVar1);
      *pdVar2 = t1;
      for (local_4c = 1; local_4c < iVar1; local_4c = local_4c + 1) {
        pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,local_4c);
        dVar3 = ON_Interval::NormalizedParameterAt((ON_Interval *)(new_domain.m_t + 1),*pdVar2);
        dVar3 = ON_Interval::ParameterAt((ON_Interval *)local_48,dVar3);
        pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,local_4c);
        *pdVar2 = dVar3;
      }
      old_domain.m_t[1]._7_1_ = true;
    }
  }
LAB_00809a8d:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return old_domain.m_t[1]._7_1_;
}

Assistant:

bool ON_PolylineCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  const int count = m_t.Count()-1;
  if ( count >= 1 )
  {
    if ( t0 == m_t[0] && t1 == m_t[count] )
      rc = true;
    else if ( t0 < t1 ) 
    {
      const ON_Interval old_domain = Domain();
      const ON_Interval new_domain(t0,t1);
      m_t[0] = t0;
      m_t[count] = t1;
      for ( int i = 1; i < count; i++ )
      {
        m_t[i] = new_domain.ParameterAt( old_domain.NormalizedParameterAt(m_t[i]) );
      }      
			rc=true;
    }
  }
	DestroyCurveTree();
  return rc;  
}